

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-util.h
# Opt level: O0

string * __thiscall
wabt::cat<char[2],char_const*,std::__cxx11::string>
          (string *__return_storage_ptr__,wabt *this,char (*args) [2],char **args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  char **args_local_1;
  char (*args_local) [2];
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  cat_compute_size<char[2],char_const*,std::__cxx11::string>
            ((char (*) [2])this,(char **)args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  cat_concatenate<char[2],char_const*,std::__cxx11::string>
            (__return_storage_ptr__,(char (*) [2])this,(char **)args,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
  return __return_storage_ptr__;
}

Assistant:

std::string cat(const Ts&... args) {
  std::string s;
  s.reserve(cat_compute_size(args...));
  cat_concatenate(s, args...);
  return s;
}